

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

File * File::parse_file_text(File *__return_storage_ptr__,ifstream *in)

{
  size_t __n;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  uint uVar6;
  istream *piVar7;
  long *plVar8;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  undefined8 uVar13;
  long lVar14;
  char cVar15;
  _Alloc_hider _Var16;
  ulong uVar17;
  anon_class_8_1_02a47b0a errorInvalidFile;
  char ch_2;
  char ch;
  vector<vm::Function,_std::allocator<vm::Function>_> functions;
  string type;
  string temp;
  anon_class_16_2_9d8d2ce4 ensureNoMoreInput;
  vector<vm::Constant,_std::allocator<vm::Constant>_> constants;
  anon_class_16_2_51529e6d reuseLine;
  string str;
  anon_class_40_5_6335b36b parseInstructions;
  int line_count;
  string line;
  anon_class_32_4_7e715f1c readLine;
  anon_class_16_2_ad521349 errorLineInfo;
  stringstream ss;
  int **local_998;
  char local_989;
  undefined1 local_988 [24];
  undefined4 local_970;
  undefined1 local_96c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  undefined1 *local_948;
  long local_940;
  undefined1 local_938;
  undefined7 uStack_937;
  Function local_928;
  stringstream *local_908;
  long *local_900;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_8f8;
  stringstream *local_8d8;
  string *local_8d0;
  long *local_8c8;
  ulong local_8c0;
  long local_8b8 [2];
  undefined1 local_8a8 [8];
  undefined1 local_8a0 [16];
  undefined5 local_890 [2];
  byte local_880;
  ulong local_878;
  int local_86c;
  pointer local_868;
  pointer local_860;
  File *local_858;
  ifstream *local_850;
  string local_848;
  string local_828;
  string local_808;
  string local_7e8;
  string local_7c8;
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  pointer local_728;
  vector<vm::Instruction,_std::allocator<vm::Instruction>_> local_720;
  undefined1 *local_708 [2];
  undefined1 local_6f8 [16];
  undefined1 *local_6e8 [2];
  undefined1 local_6d8 [48];
  undefined1 *local_6a8 [2];
  undefined1 local_698 [16];
  undefined1 *local_688 [2];
  undefined1 local_678 [16];
  undefined1 *local_668 [2];
  undefined1 local_658 [48];
  undefined1 *local_628 [2];
  undefined1 local_618 [48];
  undefined1 *local_5e8 [2];
  undefined1 local_5d8 [16];
  undefined1 *local_5c8 [2];
  undefined1 local_5b8 [16];
  undefined1 *local_5a8 [2];
  undefined1 local_598 [48];
  undefined1 *local_568 [2];
  undefined1 local_558 [16];
  undefined1 *local_548 [2];
  undefined1 local_538 [16];
  undefined1 *local_528 [2];
  undefined1 local_518 [16];
  undefined1 *local_508 [2];
  undefined1 local_4f8 [16];
  undefined1 *local_4e8 [2];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [48];
  undefined1 *local_488 [2];
  undefined1 local_478 [48];
  undefined1 *local_448 [2];
  undefined1 local_438 [16];
  undefined1 *local_428 [2];
  undefined1 local_418 [16];
  undefined1 *local_408 [2];
  undefined1 local_3f8 [16];
  undefined1 *local_3e8 [2];
  undefined1 local_3d8 [16];
  undefined1 *local_3c8 [2];
  undefined1 local_3b8 [16];
  undefined1 *local_3a8 [2];
  undefined1 local_398 [16];
  undefined1 *local_388 [2];
  undefined1 local_378 [16];
  undefined1 *local_368 [2];
  undefined1 local_358 [16];
  undefined1 *local_348 [2];
  undefined1 local_338 [16];
  undefined1 *local_328 [2];
  undefined1 local_318 [16];
  undefined1 *local_308 [2];
  undefined1 local_2f8 [16];
  undefined1 *local_2e8 [2];
  undefined1 local_2d8 [16];
  vector<vm::Function,_std::allocator<vm::Function>_> local_2c8;
  vector<vm::Constant,_std::allocator<vm::Constant>_> local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  anon_class_32_4_7e715f1c local_1e8;
  int *local_1c8;
  string *local_1c0;
  long local_1b8 [3];
  string local_1a0 [104];
  ios_base local_138 [264];
  
  local_86c = 0;
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  local_858 = __return_storage_ptr__;
  local_850 = in;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_848,"");
  local_8c8 = local_8b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c8,"");
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_1e8.in = local_850;
  local_1e8.line_count = &local_86c;
  local_998 = &local_1c8;
  local_908 = (stringstream *)local_1b8;
  local_900 = (long *)&local_998;
  local_8d8 = (stringstream *)local_1b8;
  local_8d0 = &local_848;
  local_1e8.line = &local_848;
  local_1e8.ss = (stringstream *)local_1b8;
  local_1c8 = local_1e8.line_count;
  local_1c0 = &local_848;
  parse_file_text::anon_class_32_4_7e715f1c::operator()(&local_1e8);
  local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::operator>>((istream *)local_1b8,(string *)&local_8c8);
  iVar3 = std::__cxx11::string::compare((char *)&local_8c8);
  if (iVar3 == 0) {
    *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) =
         *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) | 0x1000;
    piVar7 = std::operator>>((istream *)local_908,local_988);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) goto LAB_00113206;
    do {
      parse_file_text::anon_class_32_4_7e715f1c::operator()(&local_1e8);
      local_8a0._0_8_ = local_890;
      local_8a0._8_8_ = (stringstream **)0x0;
      local_890[0]._0_8_ = (undefined8)local_890[0] & 0xffffffffffffff00;
      local_880 = 0;
      local_928._0_8_ =
           &local_928.instructions.
            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_finish;
      local_928.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_928.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)local_928.instructions.
                            super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                            _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      local_948 = &local_938;
      local_940 = 0;
      local_938 = 0;
      local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
      local_968._M_string_length = 0;
      local_968.field_2._M_allocated_capacity =
           local_968.field_2._M_allocated_capacity & 0xffffffffffffff00;
      piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_928);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
        local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_748,local_928._0_8_,
                   &(local_928.instructions.
                     super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                     super__Vector_impl_data._M_start)->op + local_928._0_8_);
        iVar4 = try_to_int(&local_748);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_748._M_dataplus._M_p != &local_748.field_2) {
          operator_delete(local_748._M_dataplus._M_p,local_748.field_2._M_allocated_capacity + 1);
        }
        if (((long)local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4) * -0x5555555555555555 - (long)iVar4 != 0)
        goto LAB_00112d4a;
        piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_948);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00112d89;
        iVar3 = std::__cxx11::string::compare((char *)&local_948);
        if (iVar3 == 0) {
          local_8a8 = (undefined1  [8])((ulong)local_8a8 & 0xffffffffffffff00);
          *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
               *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
          piVar7 = std::operator>>((istream *)local_1b8,(char *)local_988);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_001130cb;
          if (local_988[0] != (anon_class_1_0_00000001)0x22) goto LAB_0011310a;
          while( true ) {
            while( true ) {
              plVar8 = (long *)std::istream::get((char *)local_1b8);
              uVar10 = *(ulong *)(*plVar8 + -0x18);
              if ((*(byte *)((long)plVar8 + uVar10 + 0x20) & 5) != 0) {
                local_368[0] = local_358;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_368,"no trailing quote for string constant","");
                parse_file_text::anon_class_8_1_02a47b0a::operator()
                          ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
                goto LAB_00112b57;
              }
              cVar15 = (char)&local_968;
              if (local_988[0] != (anon_class_1_0_00000001)0x5c) break;
              plVar8 = (long *)std::istream::get((char *)local_1b8);
              if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0)
              goto LAB_00112b68;
              if ((byte)local_988[0] < 0x6e) {
                uVar5 = (byte)local_988[0] - 0x22;
                if ((uVar5 < 0x3b) && ((0x400000000000021U >> ((ulong)uVar5 & 0x3f) & 1) != 0))
                goto LAB_00111eb0;
                goto LAB_00112d19;
              }
              if ((byte)local_988[0] < 0x74) {
                if ((local_988[0] == (anon_class_1_0_00000001)0x6e) ||
                   (local_988[0] == (anon_class_1_0_00000001)0x72)) goto LAB_00111eb0;
                goto LAB_00112d19;
              }
              if (local_988[0] == (anon_class_1_0_00000001)0x74) goto LAB_00111eb0;
              if (local_988[0] != (anon_class_1_0_00000001)0x78) goto LAB_00112d19;
              plVar8 = (long *)std::istream::get((char *)local_1b8);
              if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0)
              goto LAB_00112c9b;
              if (9 < (byte)((char)local_988[0] - 0x30U)) {
                if ((0x25 < (byte)local_988[0] - 0x41) ||
                   ((0x3f0000003fU >> ((ulong)((byte)local_988[0] - 0x41) & 0x3f) & 1) == 0))
                goto LAB_00113494;
                if ((5 < (byte)((char)local_988[0] + 0x9fU)) &&
                   (5 < (byte)((char)local_988[0] + 0xbfU))) goto LAB_00112fcc;
              }
              plVar8 = (long *)std::istream::get((char *)local_1b8);
              if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0)
              goto LAB_00112cda;
              if (9 < (byte)((char)local_988[0] - 0x30U)) {
                if ((0x25 < (byte)local_988[0] - 0x41) ||
                   ((0x3f0000003fU >> ((ulong)((byte)local_988[0] - 0x41) & 0x3f) & 1) == 0))
                goto LAB_00113455;
                if ((5 < (byte)((char)local_988[0] + 0x9fU)) &&
                   (5 < (byte)((char)local_988[0] + 0xbfU))) goto LAB_00112fcc;
              }
              std::__cxx11::string::push_back(cVar15);
            }
            if (local_988[0] == (anon_class_1_0_00000001)0x22) break;
LAB_00111eb0:
            std::__cxx11::string::push_back(cVar15);
          }
          if ((pointer)0xffff < local_968._M_string_length) goto LAB_00113149;
          std::variant<std::__cxx11::string,int,double>::operator=
                    ((variant<std::__cxx11::string,int,double> *)local_8a0,&local_968);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&local_948);
          if (iVar3 == 0) {
            local_8a8[0] = 1;
            *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
                 *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
            piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_968);
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0)
            goto LAB_00113188;
            local_768._M_dataplus._M_p = (pointer)&local_768.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_768,local_968._M_dataplus._M_p,
                       local_968._M_dataplus._M_p + (long)(u2 *)local_968._M_string_length);
            iVar4 = try_to_int(&local_768);
            local_988._0_4_ = iVar4;
            std::variant<std::__cxx11::string,int,double>::operator=
                      ((variant<std::__cxx11::string,int,double> *)local_8a0,(int *)local_988);
            uVar13 = local_768.field_2._M_allocated_capacity;
            _Var16._M_p = local_768._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_768._M_dataplus._M_p != &local_768.field_2) {
LAB_00111f86:
              operator_delete(_Var16._M_p,uVar13 + 1);
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)&local_948);
            if (iVar3 != 0) goto LAB_0011304d;
            local_8a8[0] = 2;
            *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
                 *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
            piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_968);
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0)
            goto LAB_0011308c;
            local_788._M_dataplus._M_p = (pointer)&local_788.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_788,local_968._M_dataplus._M_p,
                       local_968._M_dataplus._M_p + (long)(u2 *)local_968._M_string_length);
            local_988._0_8_ = try_to_double(&local_788);
            std::variant<std::__cxx11::string,int,double>::operator=
                      ((variant<std::__cxx11::string,int,double> *)local_8a0,(double *)local_988);
            uVar13 = local_788.field_2._M_allocated_capacity;
            _Var16._M_p = local_788._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_788._M_dataplus._M_p != &local_788.field_2) goto LAB_00111f86;
          }
        }
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::emplace_back<vm::Constant>
                  (&local_8f8,(Constant *)local_8a8);
        *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) =
             *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) | 0x1000;
        piVar7 = std::operator>>((istream *)local_908,&local_989);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) goto LAB_00112dc8;
        bVar2 = true;
      }
      else {
        std::__cxx11::stringbuf::str((string *)(local_8d8 + 0x18));
        bVar2 = false;
        std::ios::clear((int)local_8d8 + (int)*(undefined8 *)(*(long *)local_8d8 + -0x18));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_968._M_dataplus._M_p != &local_968.field_2) {
        operator_delete(local_968._M_dataplus._M_p,local_968.field_2._M_allocated_capacity + 1);
      }
      if (local_948 != &local_938) {
        operator_delete(local_948,CONCAT71(uStack_937,local_938) + 1);
      }
      if ((pointer *)local_928._0_8_ !=
          &local_928.instructions.
           super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete((void *)local_928._0_8_,
                        (ulong)&(local_928.instructions.
                                 super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                 ._M_impl.super__Vector_impl_data._M_finish)->field_0x1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>_&>
        ::_S_vtable._M_arr[local_880]._M_data)
                ((anon_class_1_0_00000001 *)local_988,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                  *)local_8a0);
    } while (bVar2);
    if (0xffff < (ulong)(((long)local_8f8.
                                super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_8f8.
                                super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555
                        )) goto LAB_00113251;
    local_8a8 = (undefined1  [8])&local_1e8;
    local_8a0._8_8_ = &local_8d8;
    local_890[1]._0_8_ = &local_908;
    local_8a0._0_8_ = local_1b8;
    local_890[0]._0_8_ = &local_998;
    std::operator>>((istream *)local_1b8,(string *)&local_8c8);
    iVar3 = std::__cxx11::string::compare((char *)&local_8c8);
    if (iVar3 != 0) goto LAB_00113290;
    *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) =
         *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) | 0x1000;
    piVar7 = std::operator>>((istream *)local_908,(char *)&local_928);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) goto LAB_001132cf;
    parse_file_text::anon_class_40_5_6335b36b::operator()
              ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_988,
               (anon_class_40_5_6335b36b *)local_8a8);
    local_860 = (pointer)local_988._0_8_;
    local_728 = (pointer)local_988._8_8_;
    local_868 = (pointer)local_988._16_8_;
    local_968._M_dataplus._M_p = (pointer)0x0;
    local_968._M_string_length = 0;
    local_968.field_2._M_allocated_capacity = 0;
    std::operator>>((istream *)local_1b8,(string *)&local_8c8);
    iVar3 = std::__cxx11::string::compare((char *)&local_8c8);
    if (iVar3 != 0) goto LAB_00113314;
    *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) =
         *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) | 0x1000;
    piVar7 = std::operator>>((istream *)local_908,(char *)&local_928);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) goto LAB_00113353;
    local_878 = 0;
    do {
      parse_file_text::anon_class_32_4_7e715f1c::operator()(&local_1e8);
      local_928.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_928.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_928.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_948 = &local_938;
      local_940 = 0;
      local_938 = 0;
      piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_948);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
        local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7a8,local_948,local_948 + local_940);
        iVar4 = try_to_int(&local_7a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
        if ((long)(local_968._M_string_length - (long)local_968._M_dataplus._M_p) >> 5 !=
            (long)iVar4) goto LAB_00112f0f;
        piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_948);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00112f8d;
        local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7c8,local_948,local_948 + local_940);
        uVar5 = try_to_int(&local_7c8);
        local_928.nameIndex = (short)uVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
          operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
          uVar5 = (uint)local_928.nameIndex;
        }
        uVar5 = uVar5 & 0xffff;
        uVar10 = ((long)local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
        if (uVar10 < uVar5 || uVar10 - uVar5 == 0) goto LAB_00112f4e;
        if ((&(local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
               super__Vector_impl_data._M_start)->type)[uVar5 * 0x30] != STRING) goto LAB_00112e0d;
        pvVar9 = std::get<0ul,std::__cxx11::string,int,double>
                           ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                             *)((long)&((local_8f8.
                                         super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->value).
                                       super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                       .
                                       super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                       .
                                       super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                               + (ulong)(uVar5 * 0x30)));
        iVar3 = std::__cxx11::string::compare((char *)pvVar9);
        piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_948);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00112e8b;
        local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7e8,local_948,local_948 + local_940);
        iVar4 = try_to_int(&local_7e8);
        local_928.paramSize = (u2)iVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
          operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
        }
        piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_948);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00112e4c;
        local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_808,local_948,local_948 + local_940);
        iVar4 = try_to_int(&local_808);
        local_928.level = (u2)iVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_808._M_dataplus._M_p != &local_808.field_2) {
          operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
        }
        std::vector<vm::Function,_std::allocator<vm::Function>_>::emplace_back<vm::Function>
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)&local_968,&local_928);
        *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) =
             *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) | 0x1000;
        piVar7 = std::operator>>((istream *)local_908,&local_989);
        if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) goto LAB_00112eca;
        local_878 = CONCAT71((int7)(local_878 >> 8),(byte)local_878 | iVar3 == 0);
        bVar2 = true;
      }
      else {
        std::__cxx11::stringbuf::str((string *)(local_8d8 + 0x18));
        bVar2 = false;
        std::ios::clear((int)local_8d8 + (int)*(undefined8 *)(*(long *)local_8d8 + -0x18));
      }
      if (local_948 != &local_938) {
        operator_delete(local_948,CONCAT71(uStack_937,local_938) + 1);
      }
      if (local_928.instructions.
          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_928.instructions.
                        super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_928.instructions.
                              super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_928.instructions.
                              super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    } while (bVar2);
    if ((local_878 & 1) == 0) goto LAB_00113398;
    uVar5 = (uint)(local_968._M_string_length - (long)local_968._M_dataplus._M_p >> 5);
    if ((int)uVar5 < 0x10000) {
      local_928._0_8_ = local_928._0_8_ & 0xffffffff00000000;
      if (0 < (int)uVar5) {
        do {
          piVar7 = std::operator>>((istream *)local_1b8,(string *)&local_8c8);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) goto LAB_00112bd8;
          if ((local_8c0 < 2) || (*(char *)((long)local_8c8 + (local_8c0 - 1)) != ':'))
          goto LAB_00112ba7;
          std::__cxx11::string::pop_back();
          if ((char)*local_8c8 == '.') {
            std::__cxx11::string::_M_erase((ulong)&local_8c8,0);
            std::__cxx11::stringbuf::str(local_1a0);
            std::ios::clear((int)*(undefined8 *)(local_1b8[0] + -0x18) + (int)(istream *)local_1b8);
            *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) =
                 *(uint *)(local_1a0 + *(long *)(local_1b8[0] + -0x18)) | 0x1000;
            std::operator>>((istream *)local_1b8,(char *)&local_948);
            uVar17 = 0xffffffff;
            if (((byte)local_948._0_1_ & 0xdf) != 0x46) goto LAB_001128b0;
            local_988._0_8_ = local_988 + 0x10;
            local_988._8_8_ = (pointer)0x0;
            local_988._16_8_ = local_988._16_8_ & 0xffffffffffffff00;
            piVar7 = std::operator>>((istream *)local_1b8,(string *)local_988);
            if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) {
              local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_828,local_988._0_8_,
                         (OpCode *)local_988._0_8_ + (long)(OpCode *)local_988._8_8_);
              uVar6 = try_to_int(&local_828);
              uVar17 = (ulong)uVar6;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_828._M_dataplus._M_p != &local_828.field_2) {
                operator_delete(local_828._M_dataplus._M_p,
                                local_828.field_2._M_allocated_capacity + 1);
              }
              if (uVar6 == local_928._0_4_) {
                if ((pointer)local_988._0_8_ != (pointer)(local_988 + 0x10)) {
                  operator_delete((void *)local_988._0_8_,(ulong)(local_988._16_8_ + 1));
                }
                goto LAB_001128b0;
              }
            }
            else {
              strfmt<int>(&local_268,"\".F{}:\" expected",(int *)&local_928);
              parse_file_text::anon_class_8_1_02a47b0a::operator()
                        ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
            }
            strfmt<int>(&local_288,"\".F{}:\" expected",(int *)&local_928);
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_0011304d:
            local_4c8[0] = local_4b8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_4c8,"invalid constant type","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_0011308c:
            local_488[0] = local_478;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"invalid format","")
            ;
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_001130cb:
            local_328[0] = local_318;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_328,"string constant expected","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_0011310a:
            local_348[0] = local_338;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_348,"no leading qoute for string constant","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113149:
            local_428[0] = local_418;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_428,"too long the string constant","");
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113188:
            local_448[0] = local_438;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_448,"invalid format","")
            ;
            parse_file_text::anon_class_8_1_02a47b0a::operator()
                      ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
            goto LAB_001131c7;
          }
          lVar12 = 0;
          uVar17 = 0;
          do {
            uVar10 = uVar17;
            if ((ulong)((long)(local_968._M_string_length - (long)local_968._M_dataplus._M_p) >> 5)
                <= uVar17) goto LAB_00112b57;
            uVar10 = (ulong)*(ushort *)(local_968._M_dataplus._M_p + lVar12);
            uVar11 = ((long)local_8f8.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_8f8.
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
            if (uVar11 < uVar10 || uVar11 - uVar10 == 0) goto LAB_00112b57;
            pvVar9 = std::get<0ul,std::__cxx11::string,int,double>
                               ((variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                 *)((long)&((local_8f8.
                                             super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->value).
                                           super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double>
                                           .
                                           super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Move_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_int,_double>
                                           .
                                           super__Variant_storage_alias<std::__cxx11::basic_string<char>,_int,_double>
                                   + (ulong)((uint)*(ushort *)(local_968._M_dataplus._M_p + lVar12)
                                            * 0x30)));
            __n = pvVar9->_M_string_length;
            if ((__n == local_8c0) &&
               ((__n == 0 || (iVar3 = bcmp((pvVar9->_M_dataplus)._M_p,local_8c8,__n), iVar3 == 0))))
            goto LAB_001128b0;
            uVar17 = uVar17 + 1;
            lVar12 = lVar12 + 0x20;
          } while ((uVar5 & 0x7fffffff) != uVar17);
          uVar17 = 0xffffffff;
LAB_001128b0:
          *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) =
               *(uint *)(local_908 + *(long *)(*(long *)local_908 + -0x18) + 0x18) | 0x1000;
          piVar7 = std::operator>>((istream *)local_908,(char *)&local_948);
          if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) == 0) goto LAB_00112c09;
          if ((int)uVar17 < 0) goto LAB_00112c4e;
          parse_file_text::anon_class_40_5_6335b36b::operator()
                    ((vector<vm::Instruction,_std::allocator<vm::Instruction>_> *)local_988,
                     (anon_class_40_5_6335b36b *)local_8a8);
          if ((ulong)((long)(local_968._M_string_length - (long)local_968._M_dataplus._M_p) >> 5) <=
              (uVar17 & 0xffffffff)) goto LAB_00112c8d;
          lVar14 = (uVar17 & 0xffffffff) * 0x20;
          pvVar1 = *(void **)(local_968._M_dataplus._M_p + lVar14 + 8);
          lVar12 = *(long *)(local_968._M_dataplus._M_p + lVar14 + 0x18);
          *(undefined8 *)(local_968._M_dataplus._M_p + lVar14 + 8) = local_988._0_8_;
          *(undefined8 *)((long)(local_968._M_dataplus._M_p + lVar14 + 8) + 8) = local_988._8_8_;
          *(undefined8 *)(local_968._M_dataplus._M_p + lVar14 + 0x18) = local_988._16_8_;
          local_988._0_8_ = (pointer)0x0;
          local_988._8_8_ = (pointer)0x0;
          local_988._16_8_ = (pointer)0x0;
          if ((pvVar1 != (void *)0x0) &&
             (operator_delete(pvVar1,lVar12 - (long)pvVar1),
             (pointer)local_988._0_8_ != (pointer)0x0)) {
            operator_delete((void *)local_988._0_8_,local_988._16_8_ - local_988._0_8_);
          }
          iVar3 = local_928._0_4_ + 1;
          local_928._0_4_ = iVar3;
        } while (iVar3 < (int)uVar5);
      }
      piVar7 = std::operator>>((istream *)local_850,(string *)&local_8c8);
      if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
        local_2a8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_2a8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_2a8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_8f8.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_720.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_start = local_860;
        local_720.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_finish = local_728;
        local_720.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = local_868;
        local_2c8.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)local_968._M_dataplus._M_p;
        local_2c8.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_968._M_string_length;
        local_2c8.super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)local_968.field_2._M_allocated_capacity
        ;
        local_968._M_dataplus._M_p = (pointer)0x0;
        local_968._M_string_length = 0;
        local_968.field_2._M_allocated_capacity = 0;
        File(local_858,1,&local_2a8,&local_720,&local_2c8);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector(&local_2c8);
        if (local_720.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_720.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_720.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_720.
                                super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_2a8);
        std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
                  ((vector<vm::Function,_std::allocator<vm::Function>_> *)&local_968);
        std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_8f8);
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
        if (local_8c8 != local_8b8) {
          operator_delete(local_8c8,local_8b8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        return local_858;
      }
      goto LAB_00113416;
    }
  }
  else {
LAB_001131c7:
    local_4e8[0] = local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,".constants expected","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113206:
    local_8a8 = (undefined1  [8])(local_8a0 + 8);
    local_8a0._8_8_ = (stringstream **)0x2064696c61766e69;
    local_8a0._0_8_ = (_Variadic_union<int,_double>)0xc;
    local_890[0] = 0x656e696c;
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              (*(anon_class_8_1_02a47b0a **)*local_900,(string *)((undefined8 *)*local_900)[1]);
LAB_00113251:
    local_508[0] = local_4f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_508,"too many constants","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113290:
    local_528[0] = local_518;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_528,".start expected","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_001132cf:
    local_988._0_8_ = local_988 + 0x10;
    local_988._16_8_ = (pointer)0x2064696c61766e69;
    local_970 = 0x656e696c;
    local_988._8_8_ = (pointer)0xc;
    local_96c = 0;
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              (*(anon_class_8_1_02a47b0a **)*local_900,(string *)((undefined8 *)*local_900)[1]);
LAB_00113314:
    local_668[0] = local_658;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_668,".functions expected","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113353:
    local_988._0_8_ = local_988 + 0x10;
    local_988._16_8_ = (pointer)0x2064696c61766e69;
    local_970 = 0x656e696c;
    local_988._8_8_ = (pointer)0xc;
    local_96c = 0;
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              (*(anon_class_8_1_02a47b0a **)*local_900,(string *)((undefined8 *)*local_900)[1]);
LAB_00113398:
    local_688[0] = local_678;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_688,"main() not found","");
    parse_file_text::anon_class_8_1_02a47b0a::operator()
              ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
  }
  local_6a8[0] = local_698;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6a8,"too many functions","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113416:
  local_708[0] = local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"unused content","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113455:
  local_408[0] = local_3f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"invalid hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00113494:
  local_3c8[0] = local_3b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c8,"invalid hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
  if (local_948 != &local_938) {
    operator_delete(local_948,CONCAT71(uStack_937,local_938) + 1);
  }
  if (local_928.instructions.super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_928.instructions.
                    super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_928.instructions.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_928.instructions.
                          super__Vector_base<vm::Instruction,_std::allocator<vm::Instruction>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vm::Function,_std::allocator<vm::Function>_>::~vector
            ((vector<vm::Function,_std::allocator<vm::Function>_> *)&local_968);
  if (local_860 != (pointer)0x0) {
    operator_delete(local_860,(long)local_868 - (long)local_860);
  }
  std::vector<vm::Constant,_std::allocator<vm::Constant>_>::~vector(&local_8f8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_8c8 != local_8b8) {
    operator_delete(local_8c8,local_8b8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(local_3b8);
LAB_00112b57:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
LAB_00112b68:
  local_388[0] = local_378;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"incomplete escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112ba7:
  strfmt<int>(&local_248,"\".F{}:\" expected",(int *)&local_928);
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112bd8:
  strfmt<int>(&local_228,"\".F{}:\" expected",(int *)&local_928);
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112c09:
  local_988._0_8_ = local_988 + 0x10;
  local_988._16_8_ = (pointer)0x2064696c61766e69;
  local_970 = 0x656e696c;
  local_988._8_8_ = (pointer)0xc;
  local_96c = 0;
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            (*(anon_class_8_1_02a47b0a **)*local_900,(string *)((undefined8 *)*local_900)[1]);
LAB_00112c4e:
  local_6e8[0] = local_6d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_6e8,"no such function","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112c8d:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00112c9b:
  local_3a8[0] = local_398;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3a8,"incomplete hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112cda:
  local_3e8[0] = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3e8,"incomplete hex escape seq","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112d19:
  strfmt<char>(&local_208,"unknown escape seq \"\\{}\"",local_988);
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112d4a:
  local_2e8[0] = local_2d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e8,"unordered index","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112d89:
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_308,"constant type expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112dc8:
  local_988._0_8_ = local_988 + 0x10;
  local_988._16_8_ = (pointer)0x2064696c61766e69;
  local_970 = 0x656e696c;
  local_988._8_8_ = (pointer)0xc;
  local_96c = 0;
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            (*(anon_class_8_1_02a47b0a **)*local_900,(string *)((undefined8 *)*local_900)[1]);
LAB_00112e0d:
  local_5c8[0] = local_5b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"name not found","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112e4c:
  local_628[0] = local_618;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_628,"level expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112e8b:
  local_5e8[0] = local_5d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"param_size expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112eca:
  local_988._0_8_ = local_988 + 0x10;
  local_988._16_8_ = (pointer)0x2064696c61766e69;
  local_970 = 0x656e696c;
  local_988._8_8_ = (pointer)0xc;
  local_96c = 0;
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            (*(anon_class_8_1_02a47b0a **)*local_900,(string *)((undefined8 *)*local_900)[1]);
LAB_00112f0f:
  local_548[0] = local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_548,"unordered index","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112f4e:
  local_5a8[0] = local_598;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5a8,"name not found","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112f8d:
  local_568[0] = local_558;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_568,"name_index expected","");
  parse_file_text::anon_class_8_1_02a47b0a::operator()
            ((anon_class_8_1_02a47b0a *)*local_998,(string *)local_998[1]);
LAB_00112fcc:
  __assert_fail("(\"unknown error\", false)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/./././util/util.hpp"
                ,0x1c,"int hex_digit_to_int(unsigned char)");
}

Assistant:

File File::parse_file_text(std::ifstream& in) {
    int line_count = 0;
    std::string line = "";
    std::string str = "";
    std::stringstream ss;
    const auto readLine = [&]() {
        while(std::getline(in, line)) {
            ++line_count;
            // remove comment
            if (auto ed = line.find_first_of('#'); ed != std::string::npos) {
                line.resize(ed); 
                // line.erase(line.begin()+ed, line.end());
            }
            // remove leading and trailing whitespaces
            line = trim(std::move(line));
            // not a blank line     
            if (!line.empty()) {
                ss.str(line);
                ss.clear();
                return;
            }
        }
        // eof
        line = "";
        ss.str("");
        ss.clear();
    };
    const auto reuseLine = [&]() {
        ss.str(line);
        ss.clear();
    };
    const auto errorLineInfo = [&]() {
        println(std::cerr, "line", line_count, ":\n   ", line);
    };
    const auto errorInvalidFile = [&](std::string msg) {
        errorLineInfo();
        throw InvalidFile(msg);
    };
    #define errorIf(cond, msg)    do { if ((cond)) { errorInvalidFile((msg)); } } while(false)
    #define errorIfNot(cond, msg) errorIf(!(cond), (msg))
    #define errorIfAssignFailed(lhs, rhs, msg) do { try { lhs = (rhs); } catch (const std::exception&) { errorIf(true, (msg)); } } while(false)
    auto ensureNoMoreInput = [&]() {
        if (char ch; ss >> std::skipws >> ch) {
            errorIf(true, "invalid line");
        }
    };

    readLine();

    // parse constants
    std::vector<vm::Constant> constants;
    ss >> str;
    if (str == ".constants:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {type} {value}
            readLine();
            vm::Constant constant;
            std::string temp;
            int index;
            std::string type;
            std::string value;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != constants.size(), "unordered index");
            errorIfNot(ss >> type, "constant type expected");
            if (type == "S") {
                constant.type = vm::Constant::Type::STRING;
                char ch;
                errorIfNot(ss >> std::skipws >> ch, "string constant expected");
                errorIf(ch != '\"', "no leading qoute for string constant");
                // parse the content of string
                while (true) {
                    errorIfNot(ss.get(ch), "no trailing quote for string constant");
                    if (ch == '\"') { 
                        break; 
                    }
                    if (ch == '\\') {
                        errorIfNot(ss.get(ch), "incomplete escape seq");
                        switch (ch) {
                        case '\\': value += '\\'; break;
                        case '\'': value += '\''; break;
                        case '\"': value += '\"'; break;
                        case 'n':  value += '\n'; break;
                        case 'r':  value += '\r'; break;
                        case 't':  value += '\t'; break;
                        case 'x': {
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            char v = (0xff & hex_digit_to_int(ch)) << 4;
                            errorIfNot(ss.get(ch), "incomplete hex escape seq");
                            errorIfNot(is_hex_digit(ch), "invalid hex escape seq");
                            v |= (0xff & hex_digit_to_int(ch));
                            value += v;
                        }; break;
                        default: errorIf(true, strfmt("unknown escape seq \"\\{}\"", ch));
                        }
                    }
                    else {
                        value += ch;
                    }
                }
                errorIf(value.length() > UINT16_MAX, "too long the string constant");
                constant.value = std::move(value);
            }
            else if (type == "I") {
                constant.type = vm::Constant::Type::INT;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_int(value), "out of range or invalid format");
            }
            else if (type == "D") {
                constant.type = vm::Constant::Type::DOUBLE;
                errorIfNot(ss >> std::skipws >> value, "invalid format");
                errorIfAssignFailed(constant.value, try_to_double(value), "out of range or invalid format");
            }
            else {
                errorIf(true, "invalid constant type");
            }
            constants.push_back(std::move(constant));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".constants expected");
    }
    errorIf(constants.size() > U2_MAX, "too many constants");

    // parse instructions
    auto parseInstructions = [&]() {
        std::vector<vm::Instruction> rtv;
        while(true) {
            // {index} {opcode} {param1} {param2}
            readLine();
            std::string temp;
            int index;
            std::string opName;
            // eof
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != rtv.size(), "unordered index");
            errorIfNot(ss >> opName, "opcode expected");
            opName = to_lower(opName);
            vm::Instruction ins;
            if (auto it = vm::opCodeOfName.find(opName); true) {
                errorIf(it == vm::opCodeOfName.end(), "no such opcode");
                ins.op = it->second;
            }
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                int paramCount = it->second.size();
                std::string restLine;
                errorIfNot(std::getline(ss, restLine), "parameters expected");
                auto params = split(restLine, ',');
                errorIf(params.size() != paramCount, 
                    strfmt("{} parameters expected, {} got", paramCount, params.size())
                );
                errorIfAssignFailed(ins.x, try_to_int(params[0]), 
                    strfmt("invalid first parameter: {}", params[0])
                );
                if (paramCount == 2) {
                    errorIfAssignFailed(ins.y, try_to_int(params[1]), 
                        strfmt("invalid second parameter: {}", params[1])
                    );
                }
            }
            ensureNoMoreInput();
            rtv.push_back(ins);
        }
        errorIf(rtv.size() > U2_MAX, "too many instructions");
        return rtv;
    };

    // parse start
    std::vector<vm::Instruction> start;
    ss >> str;
    if (str == ".start:") {
        ensureNoMoreInput();
        start = std::move(parseInstructions());
    }
    else {
        errorIf(true, ".start expected");
    }

    // parse functions
    std::vector<vm::Function> functions;
    bool mainFound = false;
    ss >> str;
    if (str == ".functions:") {
        ensureNoMoreInput();
        while (true) {
            // {index} {nameIndex} {paramSize} {level}
            readLine();
            vm::Function function;
            std::string temp;
            int index;
            // no more function
            if (!(ss >> temp)) { 
                reuseLine(); break; 
            }
            // parse index
            try {
                index = try_to_int(temp);
            }
            catch (const std::exception&) {
                reuseLine(); break;
            }
            errorIf(index != functions.size(), "unordered index");
            errorIfNot(ss >> temp, "name_index expected");
            errorIfAssignFailed(function.nameIndex, try_to_int(temp), "invalid name_index");
            errorIf(function.nameIndex >= constants.size(), "name not found");
            errorIf(constants[function.nameIndex].type != vm::Constant::Type::STRING, "name not found");
            if (std::get<vm::str_t>(constants[function.nameIndex].value) == "main") {
                mainFound = true;
            }
            errorIfNot(ss >> temp, "param_size expected");
            errorIfAssignFailed(function.paramSize, try_to_int(temp), "invalid param_size");
            errorIf(function.paramSize > U2_MAX, "too many parameters");
            errorIfNot(ss >> temp, "level expected");
            errorIfAssignFailed(function.level, try_to_int(temp), "invalid level");
            errorIf(function.level > U2_MAX, "too high the level");
            functions.push_back(std::move(function));
            ensureNoMoreInput();
        }
    }
    else {
        errorIf(true, ".functions expected");
    }
    errorIfNot(mainFound, "main() not found");

    int functions_count = functions.size();
    errorIf(functions_count > U2_MAX, "too many functions");
    for (int i = 0; i < functions_count; ++i) {
        errorIfNot(ss >> str, strfmt("\".F{}:\" expected", i));
        errorIf((str.length() < 2 || str.back() != ':'), strfmt("\".F{}:\" expected", i));
        str.pop_back();

        int index = -1;
        if (str.front() == '.') {
            str.erase(str.begin());
            ss.str(str);
            ss.clear();
            char ch;
            ss >> std::skipws >> ch;
            if ((ch == 'F' || ch == 'f')) {
                // .Fx
                std::string temp;
                errorIfNot(ss >> temp, strfmt("\".F{}:\" expected", i));
                errorIfAssignFailed(index, try_to_int(temp), "invalid function index");
                errorIf(index != i, strfmt("\".F{}:\" expected", i));
            }
        }
        else {
            // str is name
            index = -1;
            for (auto j = 0; j < functions_count; ++j) {
                if (std::get<std::string>(constants.at(functions.at(j).nameIndex).value) == str) {
                    index = j;
                    break;
                }
            } 
        }
        ensureNoMoreInput();
        errorIf(index < 0, "no such function");
        functions.at(index).instructions = std::move(parseInstructions());
    }

    errorIf(in >> str, "unused content");

    return File{0x00000001, std::move(constants), std::move(start), std::move(functions)};
}